

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

float * glfwGetJoystickAxes(int joy,int *count)

{
  float *pfVar1;
  
  if (count == (int *)0x0) {
    __assert_fail("count != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Wei-Parker-Guo[P]PhongSphere/glfw-3.2.1/src/input.c"
                  ,0x22e,"const float *glfwGetJoystickAxes(int, int *)");
  }
  *count = 0;
  if (_glfwInitialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    if ((uint)joy < 0x10) {
      pfVar1 = _glfwPlatformGetJoystickAxes(joy,count);
      return pfVar1;
    }
    _glfwInputError(0x10003,"Invalid joystick %i");
  }
  return (float *)0x0;
}

Assistant:

GLFWAPI const float* glfwGetJoystickAxes(int joy, int* count)
{
    assert(count != NULL);
    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (joy < 0 || joy > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick %i", joy);
        return NULL;
    }

    return _glfwPlatformGetJoystickAxes(joy, count);
}